

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseSourceName(State *state)

{
  char cVar1;
  char *str;
  long lVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int length;
  State copy;
  uint local_4c;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  undefined8 uStack_20;
  
  local_48 = state->mangled_cur;
  pcStack_40 = state->out_cur;
  local_38 = state->out_begin;
  pcStack_30 = state->out_end;
  local_28 = state->prev_name;
  uStack_20._0_4_ = state->prev_name_length;
  uStack_20._4_2_ = state->nest_level;
  uStack_20._6_1_ = state->append;
  uStack_20._7_1_ = state->overflowed;
  local_4c = 0xffffffff;
  bVar4 = ParseNumber(state,(int *)&local_4c);
  uVar3 = local_4c;
  if ((!bVar4) || (uVar8 = (ulong)local_4c, uVar8 == 0xffffffff)) {
LAB_0011308f:
    state->prev_name = local_28;
    state->prev_name_length = (undefined4)uStack_20;
    state->nest_level = uStack_20._4_2_;
    state->append = (bool)uStack_20._6_1_;
    state->overflowed = (bool)uStack_20._7_1_;
    state->out_begin = local_38;
    state->out_end = pcStack_30;
    state->mangled_cur = local_48;
    state->out_cur = pcStack_40;
    return false;
  }
  str = state->mangled_cur;
  bVar4 = (int)local_4c < 1;
  if (0 < (int)local_4c) {
    if (*str == '\0') goto LAB_0011308f;
    uVar6 = 0;
    do {
      uVar7 = uVar8;
      if (uVar8 - 1 == uVar6) break;
      uVar7 = uVar6 + 1;
      lVar5 = uVar6 + 1;
      uVar6 = uVar7;
    } while (str[lVar5] != '\0');
    bVar4 = uVar8 <= uVar7;
  }
  if (!bVar4) goto LAB_0011308f;
  if (0xb < (int)local_4c) {
    lVar5 = 0;
    cVar1 = *str;
    while ((cVar1 != '\0' && (cVar1 == "_GLOBAL__N_"[lVar5]))) {
      lVar2 = lVar5 + 1;
      lVar5 = lVar5 + 1;
      cVar1 = str[lVar2];
    }
    if ("_GLOBAL__N_"[lVar5] == '\0') {
      MaybeAppend(state,"(anonymous namespace)");
      goto LAB_00113085;
    }
  }
  MaybeAppendWithLength(state,str,local_4c);
LAB_00113085:
  state->mangled_cur = state->mangled_cur + (int)uVar3;
  return true;
}

Assistant:

static bool ParseSourceName(State *state) {
  State copy = *state;
  int length = -1;
  if (ParseNumber(state, &length) && ParseIdentifier(state, length)) {
    return true;
  }
  *state = copy;
  return false;
}